

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.h
# Opt level: O0

Entity * __thiscall
lf::assemble::UniformFEDofHandler::Entity(UniformFEDofHandler *this,gdof_idx_t dofnum)

{
  size_type sVar1;
  ostream *poVar2;
  runtime_error *this_00;
  const_reference ppEVar3;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  size_type local_18;
  gdof_idx_t dofnum_local;
  UniformFEDofHandler *this_local;
  
  local_18 = dofnum;
  dofnum_local = (gdof_idx_t)this;
  sVar1 = std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::size
                    (&this->dof_entities_);
  if (sVar1 <= (ulong)dofnum) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"Illegal dof index ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,", max = ");
    std::ostream::operator<<(poVar2,this->num_dof_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"dofnum < dof_entities_.size()",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x17b,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppEVar3 = std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::
            operator[](&this->dof_entities_,local_18);
  return *ppEVar3;
}

Assistant:

[[nodiscard]] const lf::mesh::Entity &Entity(
      gdof_idx_t dofnum) const override {
    LF_VERIFY_MSG(dofnum < dof_entities_.size(),
                  "Illegal dof index " << dofnum << ", max = " << num_dof_);
    return *dof_entities_[dofnum];
  }